

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Const * kratos::Const::constant(int64_t value,uint32_t width,bool is_signed)

{
  int64_t local_38;
  int64_t value_local;
  Const *pCStack_28;
  uint32_t width_local;
  shared_ptr<kratos::Const> p;
  bool is_signed_local;
  
  local_38 = value;
  value_local._4_4_ = width;
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  std::__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::Const>,long&,unsigned_int&,bool&>
            ((__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8,
             (allocator<kratos::Const> *)
             ((long)&p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 6),&local_38,(uint *)((long)&value_local + 4),
             (bool *)((long)&p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
  std::
  _Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Const>&>
            ((_Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&consts_,
             (__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  if (p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pCStack_28;
}

Assistant:

Const &Const::constant(int64_t value, uint32_t width, bool is_signed) {
    auto p = std::make_shared<Const>(value, width, is_signed);
    consts_.emplace(p);
    return *p;
}